

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_helper.cpp
# Opt level: O0

bool __thiscall
duckdb::TestResultHelper::CheckQueryResult
          (TestResultHelper *this,Query *query,ExecuteContext *context,
          unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
          *owned_result)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference this_00;
  const_reference pvVar5;
  ulong uVar6;
  SQLLogicTestLogger *pSVar7;
  size_type sVar8;
  long lVar9;
  ulong uVar10;
  SQLLogicTestLogger *pSVar11;
  mapped_type *this_01;
  long in_RSI;
  uint uVar12;
  AssertionHandler catchAssertionHandler_2;
  QueryResult *expected_result;
  iterator entry;
  bool hash_compare_error;
  AssertionHandler catchAssertionHandler_1;
  string success_log_1;
  bool success_1;
  idx_t i_2;
  idx_t current_column;
  idx_t current_row_1;
  AssertionHandler catchAssertionHandler;
  string success_log;
  bool success;
  idx_t c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  idx_t i_1;
  idx_t current_row;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *__range3;
  bool all_tabs;
  bool row_wise;
  idx_t expected_rows;
  bool column_count_mismatch;
  idx_t original_expected_columns;
  string digest;
  idx_t i;
  MD5Context context_1;
  string hash_value;
  string csv_error;
  string fname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  comparison_values;
  idx_t col_idx_1;
  idx_t row_idx_1;
  idx_t col_idx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> row;
  idx_t row_idx;
  vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
  rows;
  idx_t nrows;
  idx_t ncols;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  result_values_string;
  bool result_is_hash;
  bool compare_hash;
  idx_t total_value_count;
  idx_t column_count;
  idx_t row_count;
  SQLLogicTestLogger logger;
  string *query_label;
  bool query_has_label;
  SortStyle sort_style;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *values;
  idx_t expected_column_count;
  SQLLogicTestRunner *runner;
  MaterializedQueryResult *result;
  SQLLogicTestLogger *in_stack_fffffffffffff678;
  undefined1 uVar13;
  SQLLogicTestLogger *in_stack_fffffffffffff680;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff688;
  undefined4 in_stack_fffffffffffff690;
  undefined4 in_stack_fffffffffffff694;
  TestResultHelper *in_stack_fffffffffffff698;
  undefined1 *puVar14;
  undefined7 in_stack_fffffffffffff6a0;
  undefined1 in_stack_fffffffffffff6a7;
  ExecuteContext *in_stack_fffffffffffff6a8;
  SourceLineInfo *this_02;
  SQLLogicTestLogger *in_stack_fffffffffffff6b0;
  unsigned_long in_stack_fffffffffffff6b8;
  idx_t in_stack_fffffffffffff6c0;
  MaterializedQueryResult *in_stack_fffffffffffff6c8;
  SQLLogicTestLogger *in_stack_fffffffffffff6d0;
  string *in_stack_fffffffffffff6d8;
  SQLLogicTestLogger *in_stack_fffffffffffff6e0;
  idx_t in_stack_fffffffffffff6e8;
  SQLLogicTestLogger *in_stack_fffffffffffff6f0;
  allocator *paVar15;
  undefined7 in_stack_fffffffffffff6f8;
  undefined1 in_stack_fffffffffffff6ff;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_fffffffffffff700;
  MaterializedQueryResult *in_stack_fffffffffffff708;
  SQLLogicTestLogger *in_stack_fffffffffffff710;
  undefined7 in_stack_fffffffffffff720;
  undefined1 in_stack_fffffffffffff727;
  QueryResult *in_stack_fffffffffffff728;
  SQLLogicTestLogger *in_stack_fffffffffffff730;
  reference in_stack_fffffffffffff748;
  type in_stack_fffffffffffff750;
  reference in_stack_fffffffffffff758;
  SQLLogicTestLogger *in_stack_fffffffffffff760;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_fffffffffffff778;
  undefined8 in_stack_fffffffffffff780;
  MaterializedQueryResult *in_stack_fffffffffffff788;
  undefined7 in_stack_fffffffffffff790;
  undefined1 in_stack_fffffffffffff797;
  bool local_839;
  vector<duckdb::LoopDefinition,_true> *in_stack_fffffffffffff7c8;
  string *in_stack_fffffffffffff7d0;
  SQLLogicTestRunner *in_stack_fffffffffffff7d8;
  bool local_7f1;
  bool local_78a;
  bool local_789;
  SourceLineInfo local_738;
  StringRef local_728;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>,_true>
  local_6d0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>,_true>
  local_6c8;
  pointer local_6c0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_6b0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_6a8;
  byte local_699;
  undefined8 local_698;
  char **local_688;
  SourceLineInfo local_670;
  StringRef local_660;
  string local_608 [39];
  allocator local_5e1;
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [39];
  byte local_559;
  ulong local_558;
  SQLLogicTestLogger *local_550;
  long local_548;
  undefined8 local_540;
  char **local_530;
  SourceLineInfo local_518;
  StringRef local_508;
  string *in_stack_fffffffffffffb18;
  idx_t *in_stack_fffffffffffffb20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_fffffffffffffb28;
  string *in_stack_fffffffffffffb30;
  TestResultHelper *in_stack_fffffffffffffb38;
  string local_4b0 [39];
  allocator local_489;
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [39];
  undefined1 local_401;
  SQLLogicTestLogger *local_400;
  allocator local_3f1;
  string local_3f0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d0;
  ulong local_3b8;
  long local_3b0;
  reference local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_398;
  SQLLogicTestLogger *local_390;
  byte local_382;
  bool local_381;
  ulong local_380;
  byte local_371;
  SQLLogicTestLogger *local_370;
  string local_368 [32];
  string local_348 [32];
  string local_328 [7];
  undefined1 in_stack_fffffffffffffcdf;
  idx_t in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  MaterializedQueryResult *in_stack_fffffffffffffcf8;
  SQLLogicTestLogger *in_stack_fffffffffffffd00;
  TestResultHelper *in_stack_fffffffffffffd08;
  ulong local_2e8;
  idx_t in_stack_fffffffffffffd20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_fffffffffffffd28;
  idx_t in_stack_fffffffffffffd30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_fffffffffffffd40;
  string local_288 [56];
  string local_250 [56];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [39];
  byte local_1b1;
  string local_1b0 [32];
  SQLLogicTestLogger local_190;
  ulong local_140;
  ulong local_120;
  ulong local_100;
  ulong local_f8;
  undefined1 local_f0 [30];
  byte local_d2;
  bool local_d1;
  ulong local_d0;
  long local_c8;
  long local_c0;
  uint local_b8;
  long local_58;
  byte local_4a;
  char local_49;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  SQLLogicTestLogger *local_40;
  long local_38;
  type local_30;
  long local_18;
  byte local_1;
  
  uVar13 = (undefined1)((ulong)in_stack_fffffffffffff780 >> 0x38);
  local_18 = in_RSI;
  local_30 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator*((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                          *)in_stack_fffffffffffff680);
  local_38 = *(long *)(local_18 + 8);
  local_40 = *(SQLLogicTestLogger **)(local_18 + 0x90);
  local_48 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_18 + 0xa0);
  local_49 = *(char *)(local_18 + 0x98);
  local_4a = *(byte *)(local_18 + 0xb8) & 1;
  local_58 = local_18 + 0xc0;
  SQLLogicTestLogger::SQLLogicTestLogger
            (in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,
             (Command *)CONCAT17(in_stack_fffffffffffff6a7,in_stack_fffffffffffff6a0));
  bVar1 = duckdb::BaseQueryResult::HasError();
  if ((bVar1 & 1) != 0) {
    SQLLogicTestLogger::UnexpectedFailure(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
    uVar13 = (undefined1)((ulong)in_stack_fffffffffffff678 >> 0x38);
    duckdb::BaseQueryResult::GetError_abi_cxx11_();
    bVar2 = SkipErrorMessage(in_stack_fffffffffffff698,
                             (string *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690)
                            );
    if (bVar2) {
      std::atomic<bool>::operator=((atomic<bool> *)in_stack_fffffffffffff680,(bool)uVar13);
      local_1 = 1;
      local_b8 = 1;
    }
    else {
      local_1 = 0;
      local_b8 = 1;
    }
    goto LAB_007b4855;
  }
  local_c0 = duckdb::MaterializedQueryResult::RowCount();
  local_c8 = duckdb::BaseQueryResult::ColumnCount();
  local_d0 = local_c0 * local_c8;
  local_789 = true;
  if ((local_4a & 1) == 0) {
    local_78a = false;
    if (0 < *(int *)(local_38 + 0xcc)) {
      local_78a = (ulong)(long)*(int *)(local_38 + 0xcc) < local_d0;
    }
    local_789 = local_78a;
  }
  local_d1 = local_789;
  local_d2 = 0;
  sVar3 = Catch::clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_48);
  if (sVar3 == 1) {
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)in_stack_fffffffffffff680,(size_type)in_stack_fffffffffffff678);
    bVar2 = ResultIsHash(in_stack_fffffffffffff748);
    if (bVar2) {
      local_d1 = true;
      local_d2 = 1;
    }
  }
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)0x7b2944);
  DuckDBConvertResult((TestResultHelper *)
                      CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
                      in_stack_fffffffffffff788,(bool)uVar13,in_stack_fffffffffffff778);
  if ((*(byte *)(local_38 + 0xc9) & 1) != 0) {
    SQLLogicTestLogger::OutputResult
              (in_stack_fffffffffffff710,in_stack_fffffffffffff708,in_stack_fffffffffffff700);
  }
  if (local_49 == '\x01') {
    local_f8 = duckdb::BaseQueryResult::ColumnCount();
    local_100 = local_d0 / local_f8;
    vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
    ::vector((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
              *)0x7b2a27);
    std::
    vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    ::reserve((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
               *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
    for (local_120 = 0; local_120 < local_100; local_120 = local_120 + 1) {
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)0x7b2a75);
      Catch::clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
      for (local_140 = 0; local_140 < local_f8; local_140 = local_140 + 1) {
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)in_stack_fffffffffffff680,(size_type)in_stack_fffffffffffff678);
        Catch::clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff680,(value_type *)in_stack_fffffffffffff678);
      }
      std::
      vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
      ::push_back((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                   *)in_stack_fffffffffffff680,(value_type *)in_stack_fffffffffffff678);
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)0x7b2b76);
    }
    local_190.sql_query.field_2._8_8_ =
         std::
         vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
         ::begin((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                  *)in_stack_fffffffffffff678);
    local_190.sql_query.field_2._M_allocated_capacity =
         (size_type)
         std::
         vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
         ::end((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                *)in_stack_fffffffffffff678);
    std::
    sort<__gnu_cxx::__normal_iterator<duckdb::vector<std::__cxx11::string,true>*,std::vector<duckdb::vector<std::__cxx11::string,true>,std::allocator<duckdb::vector<std::__cxx11::string,true>>>>,duckdb::TestResultHelper::CheckQueryResult(duckdb::Query_const&,duckdb::ExecuteContext&,duckdb::unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<duckdb::MaterializedQueryResult>,true>)::__0>
              (local_190.sql_query.field_2._8_8_,local_190.sql_query.field_2._M_allocated_capacity);
    for (local_190.sql_query._0_8_ = 0; (ulong)local_190.sql_query._0_8_ < local_100;
        local_190.sql_query._0_8_ = local_190.sql_query._0_8_ + 1) {
      for (local_190._40_8_ = 0; (ulong)local_190._40_8_ < local_f8;
          local_190._40_8_ = local_190._40_8_ + 1) {
        vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
        ::operator[]((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                      *)in_stack_fffffffffffff680,(size_type)in_stack_fffffffffffff678);
        pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)in_stack_fffffffffffff680,(size_type)in_stack_fffffffffffff678);
        this_00 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)in_stack_fffffffffffff680,(size_type)in_stack_fffffffffffff678);
        std::__cxx11::string::operator=((string *)this_00,(string *)pvVar4);
      }
    }
    vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
    ::~vector((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
               *)0x7b2ce6);
  }
  else if (local_49 == '\x02') {
    local_190.file_name.field_2._8_8_ =
         Catch::clara::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff678);
    local_190.file_name.field_2._M_allocated_capacity =
         (size_type)
         Catch::clara::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff678);
    __first._M_current._4_4_ = in_stack_fffffffffffff694;
    __first._M_current._0_4_ = in_stack_fffffffffffff690;
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (__first,in_stack_fffffffffffff688);
  }
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)0x7b2d5e);
  sVar3 = Catch::clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_48);
  local_1b1 = 0;
  local_7f1 = false;
  if (sVar3 == 1) {
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)in_stack_fffffffffffff680,(size_type)in_stack_fffffffffffff678);
    std::__cxx11::string::string(local_1b0,(string *)pvVar5);
    local_1b1 = 1;
    local_7f1 = ResultIsFile((string *)in_stack_fffffffffffff6e0);
  }
  if ((local_1b1 & 1) != 0) {
    std::__cxx11::string::~string(local_1b0);
  }
  if (local_7f1 == false) {
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *)in_stack_fffffffffffff680,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *)in_stack_fffffffffffff678);
LAB_007b30cc:
    std::__cxx11::string::string(local_288);
    if (((*(byte *)(local_38 + 200) & 1) != 0) || ((local_d1 & 1U) != 0)) {
      duckdb::MD5Context::MD5Context((MD5Context *)&stack0xfffffffffffffd20);
      for (local_2e8 = 0; local_2e8 < local_d0; local_2e8 = local_2e8 + 1) {
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)in_stack_fffffffffffff680,(size_type)in_stack_fffffffffffff678);
        MD5Context::Add((MD5Context *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                        in_stack_fffffffffffff688._M_current);
        duckdb::MD5Context::Add(&stack0xfffffffffffffd20);
      }
      duckdb::MD5Context::FinishHex_abi_cxx11_();
      std::__cxx11::to_string(in_stack_fffffffffffff6b8);
      std::operator+(in_stack_fffffffffffff688._M_current,(char *)in_stack_fffffffffffff680);
      std::operator+(in_stack_fffffffffffff688._M_current,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff680);
      std::__cxx11::string::operator=(local_288,local_328);
      std::__cxx11::string::~string(local_328);
      std::__cxx11::string::~string(local_348);
      std::__cxx11::string::~string(local_368);
      bVar2 = (*(byte *)(local_38 + 200) & 1) != 0;
      if (bVar2) {
        SQLLogicTestLogger::OutputHash
                  (in_stack_fffffffffffff680,(string *)in_stack_fffffffffffff678);
        local_1 = 1;
      }
      local_b8 = (uint)bVar2;
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffcf8);
      if (local_b8 != 0) goto LAB_007b47ff;
    }
    if ((local_d1 & 1U) == 0) {
      local_370 = local_40;
      local_371 = 0;
      pSVar11 = local_40;
      pSVar7 = (SQLLogicTestLogger *)duckdb::BaseQueryResult::ColumnCount();
      if (pSVar11 != pSVar7) {
        local_40 = (SQLLogicTestLogger *)duckdb::BaseQueryResult::ColumnCount();
        local_371 = 1;
      }
      if (local_40 == (SQLLogicTestLogger *)0x0) {
        local_1 = 0;
        local_b8 = 1;
      }
      else {
        sVar3 = Catch::clara::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_190);
        local_380 = sVar3 / (ulong)local_40;
        local_839 = false;
        if ((SQLLogicTestLogger *)0x1 < local_40) {
          sVar3 = Catch::clara::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_190);
          sVar8 = duckdb::MaterializedQueryResult::RowCount();
          local_839 = sVar3 == sVar8;
        }
        local_381 = local_839;
        if (local_839 == false) {
          local_382 = 1;
          local_390 = &local_190;
          local_398._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               Catch::clara::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff678);
          local_3a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      Catch::clara::std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffff678);
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)in_stack_fffffffffffff680,
                                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)in_stack_fffffffffffff678), bVar2) {
            local_3a8 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_398);
            lVar9 = std::__cxx11::string::find((char)local_3a8,9);
            if (lVar9 == -1) {
              local_382 = 0;
              break;
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_398);
          }
          local_381 = (bool)(local_382 & 1);
        }
        if (local_381 == false) {
          sVar3 = Catch::clara::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_190);
          if (sVar3 % (ulong)local_40 != 0) {
            if ((local_371 & 1) == 0) {
              Catch::clara::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_190);
              SQLLogicTestLogger::NotCleanlyDivisible
                        (in_stack_fffffffffffff6d0,(idx_t)in_stack_fffffffffffff6c8,
                         in_stack_fffffffffffff6c0);
            }
            else {
              SQLLogicTestLogger::ColumnCountMismatch
                        (in_stack_fffffffffffff6e0,
                         (MaterializedQueryResult *)in_stack_fffffffffffff6d8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)in_stack_fffffffffffff6d0,(idx_t)in_stack_fffffffffffff6c8,
                         SUB81(in_stack_fffffffffffff6c0 >> 0x38,0));
            }
            local_1 = 0;
            local_b8 = 1;
            goto LAB_007b47ff;
          }
        }
        else {
          local_380 = Catch::clara::std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_190);
          local_381 = true;
        }
        uVar6 = local_380;
        uVar10 = duckdb::MaterializedQueryResult::RowCount();
        if (uVar6 == uVar10) {
          if ((local_381 & 1U) != 0) {
            local_3b0 = 0;
            local_3b8 = 0;
            do {
              bVar2 = false;
              if (local_3b8 < local_d0) {
                uVar6 = local_3b8;
                sVar3 = Catch::clara::std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_190);
                bVar2 = uVar6 < sVar3;
              }
              if (!bVar2) goto LAB_007b43aa;
              pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)in_stack_fffffffffffff680,
                                    (size_type)in_stack_fffffffffffff678);
              paVar15 = &local_3f1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_3f0,anon_var_dwarf_65ec0d + 7,paVar15);
              duckdb::StringUtil::Split((string *)&local_3d0,(string *)pvVar4);
              std::__cxx11::string::~string(local_3f0);
              std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
              pSVar11 = (SQLLogicTestLogger *)
                        Catch::clara::std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(&local_3d0);
              if (pSVar11 == local_40) {
                local_400 = (SQLLogicTestLogger *)0x0;
                while (in_stack_fffffffffffff760 = local_400,
                      pSVar11 = (SQLLogicTestLogger *)
                                Catch::clara::std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::size(&local_3d0), in_stack_fffffffffffff760 < pSVar11) {
                  in_stack_fffffffffffff750 = local_30;
                  in_stack_fffffffffffff758 =
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)in_stack_fffffffffffff680,
                                    (size_type)in_stack_fffffffffffff678);
                  std::__cxx11::string::string(local_428,(string *)in_stack_fffffffffffff758);
                  in_stack_fffffffffffff748 =
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)in_stack_fffffffffffff680,
                                    (size_type)in_stack_fffffffffffff678);
                  std::__cxx11::string::string(local_448,(string *)in_stack_fffffffffffff748);
                  puVar14 = local_f0;
                  uVar12 = local_381 & 1;
                  in_stack_fffffffffffff680 = &local_190;
                  in_stack_fffffffffffff678 = local_400;
                  pSVar11 = local_40;
                  bVar2 = CompareValues(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                                        in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                                        in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                                        in_stack_fffffffffffffd20,in_stack_fffffffffffffd28,
                                        in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffcdf,
                                        in_stack_fffffffffffffd40);
                  std::__cxx11::string::~string(local_448);
                  std::__cxx11::string::~string(local_428);
                  local_401 = bVar2;
                  if (!bVar2) {
                    local_1 = 0;
                    local_b8 = 1;
                    goto LAB_007b3e15;
                  }
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_488,"CheckQueryResult: %s:%d",&local_489);
                  std::__cxx11::string::string(local_4b0,(string *)(local_18 + 0x58));
                  StringUtil::Format<std::__cxx11::string,int>
                            (in_stack_fffffffffffff6d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff6d0,
                             (int)((ulong)in_stack_fffffffffffff6c8 >> 0x20));
                  std::__cxx11::string::~string(local_4b0);
                  std::__cxx11::string::~string(local_488);
                  std::allocator<char>::~allocator((allocator<char> *)&local_489);
                  local_508 = operator____catch_sr
                                        ((char *)in_stack_fffffffffffff680,
                                         (size_t)in_stack_fffffffffffff678);
                  Catch::SourceLineInfo::SourceLineInfo
                            (&local_518,
                             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/sqlite/result_helper.cpp"
                             ,0xbe);
                  Catch::StringRef::StringRef
                            ((StringRef *)CONCAT44(in_stack_fffffffffffff694,uVar12),(char *)pSVar11
                            );
                  capturedExpression.m_size._0_7_ = in_stack_fffffffffffff6a0;
                  capturedExpression.m_start = puVar14;
                  capturedExpression.m_size._7_1_ = in_stack_fffffffffffff6a7;
                  Catch::AssertionHandler::AssertionHandler
                            ((AssertionHandler *)CONCAT44(in_stack_fffffffffffff694,uVar12),
                             (StringRef *)pSVar11,(SourceLineInfo *)in_stack_fffffffffffff680,
                             capturedExpression,(Flags)((ulong)in_stack_fffffffffffff678 >> 0x20));
                  local_540 = std::__cxx11::string::c_str();
                  local_530 = (char **)Catch::Decomposer::operator<=
                                                 ((Decomposer *)in_stack_fffffffffffff678,
                                                  (char **)0x7b3c6f);
                  Catch::AssertionHandler::handleExpr<char_const*const&>
                            ((AssertionHandler *)in_stack_fffffffffffff6b0,
                             (ExprLhs<const_char_*const_&> *)in_stack_fffffffffffff6a8);
                  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff680);
                  Catch::AssertionHandler::~AssertionHandler
                            ((AssertionHandler *)in_stack_fffffffffffff680);
                  std::__cxx11::string::~string(local_468);
                  local_400 = (SQLLogicTestLogger *)((long)&(local_400->log_lock)._M_device + 1);
                }
                local_3b0 = local_3b0 + 1;
                local_b8 = 0;
              }
              else {
                if ((local_371 & 1) != 0) {
                  SQLLogicTestLogger::ColumnCountMismatch
                            (in_stack_fffffffffffff6e0,
                             (MaterializedQueryResult *)in_stack_fffffffffffff6d8,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)in_stack_fffffffffffff6d0,(idx_t)in_stack_fffffffffffff6c8,
                             SUB81(in_stack_fffffffffffff6c0 >> 0x38,0));
                }
                Catch::clara::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_3d0);
                SQLLogicTestLogger::SplitMismatch
                          (in_stack_fffffffffffff710,(idx_t)in_stack_fffffffffffff708,
                           (idx_t)in_stack_fffffffffffff700,
                           CONCAT17(in_stack_fffffffffffff6ff,in_stack_fffffffffffff6f8));
                local_1 = 0;
                local_b8 = 1;
              }
LAB_007b3e15:
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)0x7b3e22);
              if (local_b8 != 0) goto LAB_007b47ff;
              local_3b8 = local_3b8 + 1;
            } while( true );
          }
          local_548 = 0;
          local_550 = (SQLLogicTestLogger *)0x0;
          local_558 = 0;
          while( true ) {
            uVar6 = local_558;
            bVar2 = false;
            if (local_558 < local_d0) {
              sVar3 = Catch::clara::std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_190);
              bVar2 = uVar6 < sVar3;
            }
            if (!bVar2) goto LAB_007b43aa;
            pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                   *)in_stack_fffffffffffff680,(size_type)in_stack_fffffffffffff678)
            ;
            std::__cxx11::string::string(local_580,(string *)pvVar4);
            pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                   *)in_stack_fffffffffffff680,(size_type)in_stack_fffffffffffff678)
            ;
            std::__cxx11::string::string(local_5a0,(string *)pvVar4);
            puVar14 = local_f0;
            uVar12 = local_381 & 1;
            in_stack_fffffffffffff680 = &local_190;
            in_stack_fffffffffffff678 = local_550;
            pSVar11 = local_40;
            bVar1 = CompareValues(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                                  in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                                  in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                                  in_stack_fffffffffffffd20,in_stack_fffffffffffffd28,
                                  in_stack_fffffffffffffd30,(bool)in_stack_fffffffffffffcdf,
                                  in_stack_fffffffffffffd40);
            std::__cxx11::string::~string(local_5a0);
            std::__cxx11::string::~string(local_580);
            local_559 = bVar1 & 1;
            if (local_559 == 0) break;
            paVar15 = &local_5e1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_5e0,"CheckQueryResult: %s:%d",paVar15);
            std::__cxx11::string::string(local_608,(string *)(local_18 + 0x58));
            StringUtil::Format<std::__cxx11::string,int>
                      (in_stack_fffffffffffff6d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff6d0,(int)((ulong)in_stack_fffffffffffff6c8 >> 0x20));
            std::__cxx11::string::~string(local_608);
            std::__cxx11::string::~string(local_5e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
            local_660 = operator____catch_sr
                                  ((char *)in_stack_fffffffffffff680,
                                   (size_t)in_stack_fffffffffffff678);
            Catch::SourceLineInfo::SourceLineInfo
                      (&local_670,
                       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/sqlite/result_helper.cpp"
                       ,0xce);
            Catch::StringRef::StringRef
                      ((StringRef *)CONCAT44(in_stack_fffffffffffff694,uVar12),(char *)pSVar11);
            capturedExpression_00.m_size._0_7_ = in_stack_fffffffffffff6a0;
            capturedExpression_00.m_start = puVar14;
            capturedExpression_00.m_size._7_1_ = in_stack_fffffffffffff6a7;
            Catch::AssertionHandler::AssertionHandler
                      ((AssertionHandler *)CONCAT44(in_stack_fffffffffffff694,uVar12),
                       (StringRef *)pSVar11,(SourceLineInfo *)in_stack_fffffffffffff680,
                       capturedExpression_00,(Flags)((ulong)in_stack_fffffffffffff678 >> 0x20));
            local_698 = std::__cxx11::string::c_str();
            local_688 = (char **)Catch::Decomposer::operator<=
                                           ((Decomposer *)in_stack_fffffffffffff678,
                                            (char **)0x7b41da);
            Catch::AssertionHandler::handleExpr<char_const*const&>
                      ((AssertionHandler *)in_stack_fffffffffffff6b0,
                       (ExprLhs<const_char_*const_&> *)in_stack_fffffffffffff6a8);
            Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff680);
            Catch::AssertionHandler::~AssertionHandler
                      ((AssertionHandler *)in_stack_fffffffffffff680);
            local_550 = (SQLLogicTestLogger *)((long)&(local_550->log_lock)._M_device + 1);
            if (local_550 == local_40) {
              local_548 = local_548 + 1;
              local_550 = (SQLLogicTestLogger *)0x0;
            }
            std::__cxx11::string::~string(local_5c0);
            local_558 = local_558 + 1;
          }
          local_1 = 0;
          local_b8 = 1;
        }
        else {
          if ((local_371 & 1) == 0) {
            SQLLogicTestLogger::WrongRowCount
                      (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                       (MaterializedQueryResult *)in_stack_fffffffffffff6e0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)in_stack_fffffffffffff6d8,(idx_t)in_stack_fffffffffffff6d0,
                       SUB81((ulong)in_stack_fffffffffffff6c8 >> 0x38,0));
          }
          else {
            SQLLogicTestLogger::ColumnCountMismatch
                      (in_stack_fffffffffffff6e0,
                       (MaterializedQueryResult *)in_stack_fffffffffffff6d8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)in_stack_fffffffffffff6d0,(idx_t)in_stack_fffffffffffff6c8,
                       SUB81(in_stack_fffffffffffff6c0 >> 0x38,0));
          }
          local_1 = 0;
          local_b8 = 1;
        }
      }
    }
    else {
      local_699 = 0;
      if ((local_4a & 1) != 0) {
        local_6a8._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff678,(key_type *)0x7b442a);
        local_6b0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff678);
        bVar2 = std::__detail::operator==(&local_6a8,&local_6b0);
        if (bVar2) {
          this_01 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)in_stack_fffffffffffff680,(key_type *)in_stack_fffffffffffff678)
          ;
          std::__cxx11::string::operator=((string *)this_01,local_288);
          unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>,true>::
          unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<std::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>>>,void>
                    ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                      *)in_stack_fffffffffffff680,
                     (unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
                      *)in_stack_fffffffffffff678);
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>_>
          ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>_>
                        *)in_stack_fffffffffffff680,(key_type *)in_stack_fffffffffffff678);
          unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::operator=
                    ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                      *)in_stack_fffffffffffff680,
                     (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                      *)in_stack_fffffffffffff678);
          unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
          ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)0x7b4506);
        }
        else {
          std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
          ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                        *)0x7b453b);
          local_699 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffff680,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffff678);
        }
      }
      if ((local_d2 & 1) != 0) {
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)in_stack_fffffffffffff680,(size_type)in_stack_fffffffffffff678);
        local_699 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff680,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff678);
      }
      if ((local_699 & 1) == 0) {
        local_728 = operator____catch_sr
                              ((char *)in_stack_fffffffffffff680,(size_t)in_stack_fffffffffffff678);
        this_02 = &local_738;
        Catch::SourceLineInfo::SourceLineInfo
                  (this_02,
                   "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/sqlite/result_helper.cpp"
                   ,0xf4);
        Catch::StringRef::StringRef
                  ((StringRef *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                   (char *)in_stack_fffffffffffff688._M_current);
        capturedExpression_01.m_size._0_7_ = in_stack_fffffffffffff6a0;
        capturedExpression_01.m_start = (char *)in_stack_fffffffffffff698;
        capturedExpression_01.m_size._7_1_ = in_stack_fffffffffffff6a7;
        Catch::AssertionHandler::AssertionHandler
                  ((AssertionHandler *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690)
                   ,(StringRef *)in_stack_fffffffffffff688._M_current,
                   (SourceLineInfo *)in_stack_fffffffffffff680,capturedExpression_01,
                   (Flags)((ulong)in_stack_fffffffffffff678 >> 0x20));
        Catch::Decomposer::operator<=((Decomposer *)in_stack_fffffffffffff678,false);
        Catch::AssertionHandler::handleExpr<bool>
                  ((AssertionHandler *)in_stack_fffffffffffff6b0,(ExprLhs<bool> *)this_02);
        Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff680);
        Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff680);
        goto LAB_007b47ec;
      }
      local_6c0 = (pointer)0x0;
      local_6c8._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>_>
                   *)in_stack_fffffffffffff678,(key_type *)0x7b45cd);
      local_6d0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>_>
                  *)in_stack_fffffffffffff678);
      bVar2 = std::__detail::operator!=(&local_6c8,&local_6d0);
      if (bVar2) {
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>_>
        ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>_>
                      *)in_stack_fffffffffffff680,(key_type *)in_stack_fffffffffffff678);
        local_6c0 = std::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                    ::get((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                           *)in_stack_fffffffffffff680);
      }
      SQLLogicTestLogger::WrongResultHash
                (in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                 (MaterializedQueryResult *)
                 CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720));
      local_1 = 0;
      local_b8 = 1;
    }
LAB_007b47ff:
    std::__cxx11::string::~string(local_288);
  }
  else {
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)in_stack_fffffffffffff680,(size_type)in_stack_fffffffffffff678);
    std::__cxx11::string::string(local_1f8,(string *)pvVar5);
    SQLLogicTestRunner::LoopReplacement
              (in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::string::string(local_218);
    std::__cxx11::string::string(local_250,local_1d8);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            *)in_stack_fffffffffffff680,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            *)in_stack_fffffffffffff678);
    LoadResultFromFile(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28
                       ,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *)in_stack_fffffffffffff680,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *)in_stack_fffffffffffff678);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)0x7b2f31);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)0x7b2f3e);
    std::__cxx11::string::~string(local_250);
    uVar6 = std::__cxx11::string::empty();
    bVar2 = (uVar6 & 1) == 0;
    if (bVar2) {
      SQLLogicTestLogger::PrintErrorHeader
                (in_stack_fffffffffffff680,(string *)in_stack_fffffffffffff678);
      local_1 = 0;
    }
    local_b8 = (uint)bVar2;
    std::__cxx11::string::~string(local_218);
    std::__cxx11::string::~string(local_1d8);
    if (local_b8 == 0) goto LAB_007b30cc;
  }
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0x7b482a);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0x7b4837);
LAB_007b4855:
  SQLLogicTestLogger::~SQLLogicTestLogger(in_stack_fffffffffffff680);
  return (bool)(local_1 & 1);
LAB_007b43aa:
  if ((local_371 & 1) == 0) {
LAB_007b47ec:
    local_1 = 1;
    local_b8 = 1;
  }
  else {
    SQLLogicTestLogger::ColumnCountMismatchCorrectResult
              (in_stack_fffffffffffff760,(idx_t)in_stack_fffffffffffff758,
               (idx_t)in_stack_fffffffffffff750,(MaterializedQueryResult *)in_stack_fffffffffffff748
              );
    local_1 = 0;
    local_b8 = 1;
  }
  goto LAB_007b47ff;
}

Assistant:

bool TestResultHelper::CheckQueryResult(const Query &query, ExecuteContext &context,
                                        duckdb::unique_ptr<MaterializedQueryResult> owned_result) {
	auto &result = *owned_result;
	auto &runner = query.runner;
	auto expected_column_count = query.expected_column_count;
	auto &values = query.values;
	auto sort_style = query.sort_style;
	auto query_has_label = query.query_has_label;
	auto &query_label = query.query_label;

	SQLLogicTestLogger logger(context, query);
	if (result.HasError()) {
		logger.UnexpectedFailure(result);
		if (SkipErrorMessage(result.GetError())) {
			runner.finished_processing_file = true;
			return true;
		}
		return false;
	}
	idx_t row_count = result.RowCount();
	idx_t column_count = result.ColumnCount();
	idx_t total_value_count = row_count * column_count;
	bool compare_hash =
	    query_has_label || (runner.hash_threshold > 0 && total_value_count > idx_t(runner.hash_threshold));
	bool result_is_hash = false;
	// check if the current line (the first line of the result) is a hash value
	if (values.size() == 1 && ResultIsHash(values[0])) {
		compare_hash = true;
		result_is_hash = true;
	}

	vector<string> result_values_string;
	DuckDBConvertResult(result, runner.original_sqlite_test, result_values_string);
	if (runner.output_result_mode) {
		logger.OutputResult(result, result_values_string);
	}

	// perform any required query sorts
	if (sort_style == SortStyle::ROW_SORT) {
		// row-oriented sorting
		idx_t ncols = result.ColumnCount();
		idx_t nrows = total_value_count / ncols;
		vector<vector<string>> rows;
		rows.reserve(nrows);
		for (idx_t row_idx = 0; row_idx < nrows; row_idx++) {
			vector<string> row;
			row.reserve(ncols);
			for (idx_t col_idx = 0; col_idx < ncols; col_idx++) {
				row.push_back(std::move(result_values_string[row_idx * ncols + col_idx]));
			}
			rows.push_back(std::move(row));
		}
		// sort the individual rows
		std::sort(rows.begin(), rows.end(), [](const vector<string> &a, const vector<string> &b) {
			for (idx_t col_idx = 0; col_idx < a.size(); col_idx++) {
				if (a[col_idx] != b[col_idx]) {
					return a[col_idx] < b[col_idx];
				}
			}
			return false;
		});

		// now reconstruct the values from the rows
		for (idx_t row_idx = 0; row_idx < nrows; row_idx++) {
			for (idx_t col_idx = 0; col_idx < ncols; col_idx++) {
				result_values_string[row_idx * ncols + col_idx] = std::move(rows[row_idx][col_idx]);
			}
		}
	} else if (sort_style == SortStyle::VALUE_SORT) {
		// sort values independently
		std::sort(result_values_string.begin(), result_values_string.end());
	}

	vector<string> comparison_values;
	if (values.size() == 1 && ResultIsFile(values[0])) {
		auto fname = runner.LoopReplacement(values[0], context.running_loops);
		string csv_error;
		comparison_values = LoadResultFromFile(fname, result.names, expected_column_count, csv_error);
		if (!csv_error.empty()) {
			logger.PrintErrorHeader(csv_error);
			return false;
		}
	} else {
		comparison_values = values;
	}

	// compute the hash of the results if there is a hash label or we are past the hash threshold
	string hash_value;
	if (runner.output_hash_mode || compare_hash) {
		MD5Context context;
		for (idx_t i = 0; i < total_value_count; i++) {
			context.Add(result_values_string[i]);
			context.Add("\n");
		}
		string digest = context.FinishHex();
		hash_value = to_string(total_value_count) + " values hashing to " + digest;
		if (runner.output_hash_mode) {
			logger.OutputHash(hash_value);
			return true;
		}
	}

	if (!compare_hash) {
		// check if the row/column count matches
		idx_t original_expected_columns = expected_column_count;
		bool column_count_mismatch = false;
		if (expected_column_count != result.ColumnCount()) {
			// expected column count is different from the count found in the result
			// we try to keep going with the number of columns in the result
			expected_column_count = result.ColumnCount();
			column_count_mismatch = true;
		}
		if (expected_column_count == 0) {
			return false;
		}
		idx_t expected_rows = comparison_values.size() / expected_column_count;
		// we first check the counts: if the values are equal to the amount of rows we expect the results to be row-wise
		bool row_wise = expected_column_count > 1 && comparison_values.size() == result.RowCount();
		if (!row_wise) {
			// the counts do not match up for it to be row-wise
			// however, this can also be because the query returned an incorrect # of rows
			// we make a guess: if everything contains tabs, we still treat the input as row wise
			bool all_tabs = true;
			for (auto &val : comparison_values) {
				if (val.find('\t') == string::npos) {
					all_tabs = false;
					break;
				}
			}
			row_wise = all_tabs;
		}
		if (row_wise) {
			// values are displayed row-wise, format row wise with a tab
			expected_rows = comparison_values.size();
			row_wise = true;
		} else if (comparison_values.size() % expected_column_count != 0) {
			if (column_count_mismatch) {
				logger.ColumnCountMismatch(result, query.values, original_expected_columns, row_wise);
			} else {
				logger.NotCleanlyDivisible(expected_column_count, comparison_values.size());
			}
			return false;
		}
		if (expected_rows != result.RowCount()) {
			if (column_count_mismatch) {
				logger.ColumnCountMismatch(result, query.values, original_expected_columns, row_wise);
			} else {
				logger.WrongRowCount(expected_rows, result, comparison_values, expected_column_count, row_wise);
			}
			return false;
		}

		if (row_wise) {
			idx_t current_row = 0;
			for (idx_t i = 0; i < total_value_count && i < comparison_values.size(); i++) {
				// split based on tab character
				auto splits = StringUtil::Split(comparison_values[i], "\t");
				if (splits.size() != expected_column_count) {
					if (column_count_mismatch) {
						logger.ColumnCountMismatch(result, query.values, original_expected_columns, row_wise);
					}
					logger.SplitMismatch(i + 1, expected_column_count, splits.size());
					return false;
				}
				for (idx_t c = 0; c < splits.size(); c++) {
					bool success = CompareValues(
					    logger, result, result_values_string[current_row * expected_column_count + c], splits[c],
					    current_row, c, comparison_values, expected_column_count, row_wise, result_values_string);
					if (!success) {
						return false;
					}
					// we do this just to increment the assertion counter
					string success_log =
					    StringUtil::Format("CheckQueryResult: %s:%d", query.file_name, query.query_line);
					REQUIRE(success_log.c_str());
				}
				current_row++;
			}
		} else {
			idx_t current_row = 0, current_column = 0;
			for (idx_t i = 0; i < total_value_count && i < comparison_values.size(); i++) {
				bool success = CompareValues(logger, result,
				                             result_values_string[current_row * expected_column_count + current_column],
				                             comparison_values[i], current_row, current_column, comparison_values,
				                             expected_column_count, row_wise, result_values_string);
				if (!success) {
					return false;
				}
				// we do this just to increment the assertion counter
				string success_log = StringUtil::Format("CheckQueryResult: %s:%d", query.file_name, query.query_line);
				REQUIRE(success_log.c_str());

				current_column++;
				if (current_column == expected_column_count) {
					current_row++;
					current_column = 0;
				}
			}
		}
		if (column_count_mismatch) {
			logger.ColumnCountMismatchCorrectResult(original_expected_columns, expected_column_count, result);
			return false;
		}
	} else {
		bool hash_compare_error = false;
		if (query_has_label) {
			// the query has a label: check if the hash has already been computed
			auto entry = runner.hash_label_map.find(query_label);
			if (entry == runner.hash_label_map.end()) {
				// not computed yet: add it tot he map
				runner.hash_label_map[query_label] = hash_value;
				runner.result_label_map[query_label] = std::move(owned_result);
			} else {
				hash_compare_error = entry->second != hash_value;
			}
		}
		if (result_is_hash) {
			D_ASSERT(values.size() == 1);
			hash_compare_error = values[0] != hash_value;
		}
		if (hash_compare_error) {
			QueryResult *expected_result = nullptr;
			if (runner.result_label_map.find(query_label) != runner.result_label_map.end()) {
				expected_result = runner.result_label_map[query_label].get();
			}
			logger.WrongResultHash(expected_result, result);
			return false;
		}
		REQUIRE(!hash_compare_error);
	}
	return true;
}